

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

void fft(float *in,int N,float *out)

{
  int i;
  int iVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  int n;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (N == 1) {
    *out = *in;
    out[1] = 0.0;
  }
  else {
    iVar3 = (int)((long)N / 2);
    if ((N - iVar3) - iVar3 == 1) {
      iVar3 = 0;
      uVar4 = 0;
      if (0 < N) {
        uVar4 = (ulong)(uint)N;
      }
      for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
        fVar9 = 0.0;
        fVar10 = 0.0;
        iVar1 = 0;
        for (uVar5 = 0; (uint)N != uVar5; uVar5 = uVar5 + 1) {
          fVar9 = fVar9 + (float)(&DAT_00189710)[iVar1 % 400] * in[uVar5];
          fVar10 = fVar10 + (float)(&(anonymous_namespace)::global_cache)[iVar1 % 400] * -in[uVar5];
          iVar1 = iVar1 + iVar3;
        }
        *(ulong *)(out + uVar7 * 2) = CONCAT44(fVar10,fVar9);
        iVar3 = iVar3 + (int)(400 / (long)N);
      }
    }
    else {
      pfVar2 = in + N;
      uVar4 = 0;
      uVar7 = 0;
      if (0 < iVar3) {
        uVar7 = (long)N / 2 & 0xffffffff;
      }
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        pfVar2[uVar4] = in[uVar4 * 2];
      }
      lVar6 = (long)(N * 2);
      fft(pfVar2,iVar3,out + lVar6);
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        pfVar2[uVar4] = in[uVar4 * 2 + 1];
      }
      fft(pfVar2,iVar3,out + lVar6 + N);
      pfVar2 = (float *)&(anonymous_namespace)::global_cache;
      while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
        fVar9 = *pfVar2;
        fVar10 = (float)*(undefined8 *)(out + N + lVar6);
        fVar14 = pfVar2[400] * fVar10;
        fVar11 = (float)((ulong)*(undefined8 *)(out + N + lVar6) >> 0x20);
        fVar15 = pfVar2[400] * fVar11;
        fVar12 = (float)*(undefined8 *)(out + lVar6);
        fVar13 = (float)((ulong)*(undefined8 *)(out + lVar6) >> 0x20);
        *(ulong *)out = CONCAT44(-fVar9 * fVar10 + fVar15 + fVar13,fVar9 * fVar11 + fVar14 + fVar12)
        ;
        *(ulong *)(out + (long)iVar3 * 2) =
             CONCAT44(fVar9 * fVar10 + (fVar13 - fVar15),-fVar9 * fVar11 + (fVar12 - fVar14));
        out = out + 2;
        pfVar2 = pfVar2 + (int)(400 / (long)N);
      }
    }
  }
  return;
}

Assistant:

static void fft(float* in, int N, float* out) {
    if (N == 1) {
        out[0] = in[0];
        out[1] = 0;
        return;
    }

    const int half_N = N / 2;
    if (N - half_N*2 == 1) {
        dft(in, N, out);
        return;
    }

    float* even = in + N;
    for (int i = 0; i < half_N; ++i) {
        even[i]= in[2*i];
    }
    float* even_fft = out + 2 * N;
    fft(even, half_N, even_fft);

    float* odd = even;
    for (int i = 0; i < half_N; ++i) {
        odd[i] = in[2*i + 1];
    }
    float* odd_fft = even_fft + N;
    fft(odd, half_N, odd_fft);

    const int sin_cos_step = SIN_COS_N_COUNT / N;
    for (int k = 0; k < half_N; k++) {
        int idx = k * sin_cos_step; // t = 2*M_PI*k/N
        float re = global_cache.cos_vals[idx]; // cos(t)
        float im = -global_cache.sin_vals[idx]; // sin(t)

        float re_odd = odd_fft[2*k + 0];
        float im_odd = odd_fft[2*k + 1];

        out[2*k + 0] = even_fft[2*k + 0] + re*re_odd - im*im_odd;
        out[2*k + 1] = even_fft[2*k + 1] + re*im_odd + im*re_odd;

        out[2*(k + half_N) + 0] = even_fft[2*k + 0] - re*re_odd + im*im_odd;
        out[2*(k + half_N) + 1] = even_fft[2*k + 1] - re*im_odd - im*re_odd;
    }
}